

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-core.c
# Opt level: O1

gchar ** media_player2_proxy_get_supported_uri_schemes(MediaPlayer2 *object)

{
  undefined4 uVar1;
  GType GVar2;
  long lVar3;
  gchar **ppgVar4;
  undefined8 uVar5;
  long lVar6;
  
  GVar2 = media_player2_proxy_get_type();
  lVar3 = g_type_check_instance_cast(object,GVar2);
  ppgVar4 = (gchar **)g_datalist_get_data(*(undefined8 *)(lVar3 + 0x20),"SupportedUriSchemes");
  if (ppgVar4 == (gchar **)0x0) {
    uVar5 = g_dbus_proxy_get_type();
    uVar5 = g_type_check_instance_cast(lVar3,uVar5);
    lVar6 = g_dbus_proxy_get_cached_property(uVar5,"SupportedUriSchemes");
    if (lVar6 == 0) {
      ppgVar4 = (gchar **)0x0;
    }
    else {
      ppgVar4 = (gchar **)g_variant_get_strv(lVar6,0);
      uVar5 = *(undefined8 *)(lVar3 + 0x20);
      uVar1 = g_quark_from_string("SupportedUriSchemes");
      g_datalist_id_set_data_full(uVar5,uVar1,ppgVar4,g_free);
      g_variant_unref(lVar6);
    }
  }
  return ppgVar4;
}

Assistant:

static const gchar *const *
media_player2_proxy_get_supported_uri_schemes (MediaPlayer2 *object)
{
  MediaPlayer2Proxy *proxy = MEDIA_PLAYER2_PROXY (object);
  GVariant *variant;
  const gchar *const *value = NULL;
  value = g_datalist_get_data (&proxy->priv->qdata, "SupportedUriSchemes");
  if (value != NULL)
    return value;
  variant = g_dbus_proxy_get_cached_property (G_DBUS_PROXY (proxy), "SupportedUriSchemes");
  if (variant != NULL)
    {
      value = g_variant_get_strv (variant, NULL);
      g_datalist_set_data_full (&proxy->priv->qdata, "SupportedUriSchemes", (gpointer) value, g_free);
      g_variant_unref (variant);
    }
  return value;
}